

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ACT_TYPE __thiscall despot::POMCPPrior::GetAction(POMCPPrior *this,State *state)

{
  int iVar1;
  vector<int,_std::allocator<int>_> *vec;
  
  (*this->_vptr_POMCPPrior[9])();
  if ((this->preferred_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->preferred_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if ((this->legal_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->legal_actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar1 = (*this->model_->_vptr_DSPOMDP[5])();
      iVar1 = Random::NextInt((Random *)&Random::RANDOM,iVar1);
      return iVar1;
    }
    vec = &this->legal_actions_;
  }
  else {
    vec = &this->preferred_actions_;
  }
  iVar1 = Random::NextElement<int>((Random *)&Random::RANDOM,vec);
  return iVar1;
}

Assistant:

ACT_TYPE POMCPPrior::GetAction(const State& state) {
	ComputePreference(state);

	if (preferred_actions_.size() != 0)
		return Random::RANDOM.NextElement(preferred_actions_);

	if (legal_actions_.size() != 0)
		return Random::RANDOM.NextElement(legal_actions_);

	return Random::RANDOM.NextInt(model_->NumActions());
}